

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensor.h
# Opt level: O2

void __thiscall Sensor::~Sensor(Sensor *this)

{
  this->_vptr_Sensor = (_func_int **)&PTR__Sensor_0017bc58;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::~DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->R_);
  std::__cxx11::string::~string((string *)&this->name_);
  return;
}

Assistant:

virtual ~Sensor() {}